

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
make_charset_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,detail *this,
          compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          *chset,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr,
          syntax_option_type flags)

{
  _WordT _Var1;
  _WordT _Var2;
  bool bVar3;
  posix_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *matcher_00;
  charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  *matcher_01;
  charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::basic_chset<char>_>
  *matcher_02;
  charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::basic_chset<char>_>
  *matcher_03;
  charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  *matcher_04;
  charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  matcher;
  compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  local_68;
  
  if (((ulong)tr & 8) == 0) {
    bVar3 = basic_chset_8bit<char>::empty((basic_chset_8bit<char> *)this);
    _Var1 = local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
            super__Base_bitset<4UL>._M_w[0];
    if ((bVar3) && (*(long *)(this + 0x28) == *(long *)(this + 0x30))) {
      local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>.
      _M_w[0] = CONCAT71(local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                         super__Base_bitset<4UL>._M_w[0]._1_7_,this[0x20]);
      _Var2 = local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
              super__Base_bitset<4UL>._M_w[0];
      local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>.
      _M_w[0]._4_4_ = SUB84(_Var1,4);
      local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>.
      _M_w[0]._0_4_ = CONCAT22(*(undefined2 *)(this + 0x22),(short)_Var2);
      make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
                (__return_storage_ptr__,(detail *)&local_68,matcher_00);
    }
    else {
      if (((ulong)tr & 2) == 0) {
        compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
        ::compound_charset(&local_68,
                           (compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                            *)this);
        make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>>
                  (__return_storage_ptr__,(detail *)&local_68,matcher_01);
      }
      else {
        compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
        ::compound_charset(&local_68,
                           (compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                            *)this);
        make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>>
                  (__return_storage_ptr__,(detail *)&local_68,matcher_04);
      }
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&local_68.posix_no_.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    }
  }
  else if (((ulong)tr & 2) == 0) {
    local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w
    [0] = *(_WordT *)this;
    local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w
    [1] = *(_WordT *)(this + 8);
    local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w
    [2] = *(_WordT *)(this + 0x10);
    local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w
    [3] = *(_WordT *)(this + 0x18);
    merge_charset<char,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (&local_68.super_basic_chset<char>,
               (compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                *)this,(regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)chset);
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,boost::xpressive::detail::basic_chset<char>>>
              (__return_storage_ptr__,(detail *)&local_68,matcher_02);
  }
  else {
    local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w
    [0] = *(_WordT *)this;
    local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w
    [1] = *(_WordT *)(this + 8);
    local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w
    [2] = *(_WordT *)(this + 0x10);
    local_68.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w
    [3] = *(_WordT *)(this + 0x18);
    merge_charset<char,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (&local_68.super_basic_chset<char>,
               (compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                *)this,(regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)chset);
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>>
              (__return_storage_ptr__,(detail *)&local_68,matcher_03);
  }
  return __return_storage_ptr__;
}

Assistant:

inline sequence<BidiIter> make_charset_xpression
(
    compound_charset<Traits> &chset
  , Traits const &tr
  , regex_constants::syntax_option_type flags
)
{
    typedef typename Traits::char_type char_type;
    bool const icase = (0 != (regex_constants::icase_ & flags));
    bool const optimize = is_narrow_char<char_type>::value && 0 != (regex_constants::optimize & flags);

    // don't care about compile speed -- fold eveything into a bitset<256>
    if(optimize)
    {
        typedef basic_chset<char_type> charset_type;
        charset_type charset(chset.base());
        if(icase)
        {
            charset_matcher<Traits, mpl::true_, charset_type> matcher(charset);
            merge_charset(matcher.charset_, chset, tr);
            return make_dynamic<BidiIter>(matcher);
        }
        else
        {
            charset_matcher<Traits, mpl::false_, charset_type> matcher(charset);
            merge_charset(matcher.charset_, chset, tr);
            return make_dynamic<BidiIter>(matcher);
        }
    }

    // special case to make [[:digit:]] fast
    else if(chset.base().empty() && chset.posix_no().empty())
    {
        BOOST_ASSERT(0 != chset.posix_yes());
        posix_charset_matcher<Traits> matcher(chset.posix_yes(), chset.is_inverted());
        return make_dynamic<BidiIter>(matcher);
    }

    // default, slow
    else
    {
        if(icase)
        {
            charset_matcher<Traits, mpl::true_> matcher(chset);
            return make_dynamic<BidiIter>(matcher);
        }
        else
        {
            charset_matcher<Traits, mpl::false_> matcher(chset);
            return make_dynamic<BidiIter>(matcher);
        }
    }
}